

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O2

void * memset_zero_avx(int32_t *dest,__m256i *zero,size_t count)

{
  longlong *plVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  ulong uVar5;
  
  for (uVar5 = 0; (uint)uVar5 < ((uint)count & 0xffffffe0); uVar5 = uVar5 + 0x20) {
    lVar2 = (*zero)[1];
    lVar3 = (*zero)[2];
    lVar4 = (*zero)[3];
    plVar1 = (longlong *)(dest + uVar5);
    *plVar1 = (*zero)[0];
    plVar1[1] = lVar2;
    plVar1[2] = lVar3;
    plVar1[3] = lVar4;
    lVar2 = (*zero)[1];
    lVar3 = (*zero)[2];
    lVar4 = (*zero)[3];
    plVar1 = (longlong *)(dest + uVar5 + 8);
    *plVar1 = (*zero)[0];
    plVar1[1] = lVar2;
    plVar1[2] = lVar3;
    plVar1[3] = lVar4;
    lVar2 = (*zero)[1];
    lVar3 = (*zero)[2];
    lVar4 = (*zero)[3];
    plVar1 = (longlong *)(dest + uVar5 + 0x10);
    *plVar1 = (*zero)[0];
    plVar1[1] = lVar2;
    plVar1[2] = lVar3;
    plVar1[3] = lVar4;
    lVar2 = (*zero)[1];
    lVar3 = (*zero)[2];
    lVar4 = (*zero)[3];
    plVar1 = (longlong *)(dest + uVar5 + 0x18);
    *plVar1 = (*zero)[0];
    plVar1[1] = lVar2;
    plVar1[2] = lVar3;
    plVar1[3] = lVar4;
  }
  for (; (uint)uVar5 < ((uint)count & 0xfffffff8); uVar5 = uVar5 + 8) {
    lVar2 = (*zero)[1];
    lVar3 = (*zero)[2];
    lVar4 = (*zero)[3];
    plVar1 = (longlong *)(dest + uVar5);
    *plVar1 = (*zero)[0];
    plVar1[1] = lVar2;
    plVar1[2] = lVar3;
    plVar1[3] = lVar4;
  }
  while( true ) {
    if (count <= (uVar5 & 0xffffffff)) break;
    dest[uVar5 & 0xffffffff] = 0;
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  return dest;
}

Assistant:

static void *memset_zero_avx(int32_t *dest, const __m256i *zero, size_t count) {
  unsigned int i = 0;
  for (i = 0; i < (count & 0xffffffe0); i += 32) {
    _mm256_storeu_si256((__m256i *)(dest + i), *zero);
    _mm256_storeu_si256((__m256i *)(dest + i + 8), *zero);
    _mm256_storeu_si256((__m256i *)(dest + i + 16), *zero);
    _mm256_storeu_si256((__m256i *)(dest + i + 24), *zero);
  }
  for (; i < (count & 0xfffffff8); i += 8) {
    _mm256_storeu_si256((__m256i *)(dest + i), *zero);
  }
  for (; i < count; i++) {
    dest[i] = 0;
  }
  return dest;
}